

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  MessageOptions *in_stack_ffffffffffffff60;
  
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x50c85d);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)0x50c86b);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)0x50c879);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Clear
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)0x50c887);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x50c895);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)0x50c8a6);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Clear
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)0x50c8b7);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x50c8c8);
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x50c928);
    }
    if ((uVar1 & 2) != 0) {
      MessageOptions::Clear(in_stack_ffffffffffffff60);
    }
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void DescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  field_.Clear();
  nested_type_.Clear();
  enum_type_.Clear();
  extension_range_.Clear();
  extension_.Clear();
  oneof_decl_.Clear();
  reserved_range_.Clear();
  reserved_name_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}